

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_handler.c
# Opt level: O2

void ngx_stream_close_connection(ngx_connection_t *c)

{
  ngx_pool_t *pool;
  
  if ((c->log->log_level & 0x400) != 0) {
    ngx_log_error_core(8,c->log,0,"close stream connection: %d",(ulong)(uint)c->fd);
  }
  pool = c->pool;
  ngx_close_connection(c);
  ngx_destroy_pool(pool);
  return;
}

Assistant:

static void
ngx_stream_close_connection(ngx_connection_t *c)
{
    ngx_pool_t  *pool;

    ngx_log_debug1(NGX_LOG_DEBUG_STREAM, c->log, 0,
                   "close stream connection: %d", c->fd);

#if (NGX_STREAM_SSL)

    if (c->ssl) {
        if (ngx_ssl_shutdown(c) == NGX_AGAIN) {
            c->ssl->handler = ngx_stream_close_connection;
            return;
        }
    }

#endif

#if (NGX_STAT_STUB)
    (void) ngx_atomic_fetch_add(ngx_stat_active, -1);
#endif

    pool = c->pool;

    ngx_close_connection(c);

    ngx_destroy_pool(pool);
}